

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::overrideNullLocalWorkSize
          (CLIntercept *this,cl_uint work_dim,size_t *global_work_size,size_t **local_work_size)

{
  long *in_RCX;
  ulong *in_RDX;
  int in_ESI;
  CLIntercept *in_RDI;
  float __x;
  float __x_00;
  float __x_01;
  lock_guard<std::mutex> lock_2;
  lock_guard<std::mutex> lock_1;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  
  if (*in_RCX == 0) {
    if (in_ESI == 1) {
      if ((in_RDI->m_Config).NullLocalWorkSizeX != 0) {
        if (*in_RDX % (in_RDI->m_Config).NullLocalWorkSizeX == 0) {
          *in_RCX = (long)&(in_RDI->m_Config).NullLocalWorkSizeX;
        }
        else {
          std::lock_guard<std::mutex>::lock_guard
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          logf(in_RDI,__x);
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f7d8d);
        }
      }
    }
    else if (in_ESI == 2) {
      if (((in_RDI->m_Config).NullLocalWorkSizeX != 0) &&
         ((in_RDI->m_Config).NullLocalWorkSizeY != 0)) {
        if ((*in_RDX % (in_RDI->m_Config).NullLocalWorkSizeX == 0) &&
           (in_RDX[1] % (in_RDI->m_Config).NullLocalWorkSizeY == 0)) {
          *in_RCX = (long)&(in_RDI->m_Config).NullLocalWorkSizeX;
        }
        else {
          std::lock_guard<std::mutex>::lock_guard
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          logf(in_RDI,__x_00);
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f7e7b);
        }
      }
    }
    else if ((((in_ESI == 3) && ((in_RDI->m_Config).NullLocalWorkSizeX != 0)) &&
             ((in_RDI->m_Config).NullLocalWorkSizeY != 0)) &&
            ((in_RDI->m_Config).NullLocalWorkSizeZ != 0)) {
      if (((*in_RDX % (in_RDI->m_Config).NullLocalWorkSizeX == 0) &&
          (in_RDX[1] % (in_RDI->m_Config).NullLocalWorkSizeY == 0)) &&
         (in_RDX[2] % (in_RDI->m_Config).NullLocalWorkSizeZ == 0)) {
        *in_RCX = (long)&(in_RDI->m_Config).NullLocalWorkSizeX;
      }
      else {
        std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
        ;
        logf(in_RDI,__x_01);
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f7fae);
      }
    }
  }
  return;
}

Assistant:

void CLIntercept::overrideNullLocalWorkSize(
    const cl_uint work_dim,
    const size_t* global_work_size,
    const size_t*& local_work_size )
{
    if( local_work_size == NULL )
    {
        switch( work_dim )
        {
        case 1:
            if( m_Config.NullLocalWorkSizeX != 0 )
            {
                if( global_work_size[0] % m_Config.NullLocalWorkSizeX == 0 )
                {
                    local_work_size = &m_Config.NullLocalWorkSizeX;
                }
                else
                {
                    std::lock_guard<std::mutex> lock(m_Mutex);
                    logf( "Couldn't override NULL local work size: < %zu > %% < %zu > != 0!\n",
                        global_work_size[0],
                        m_Config.NullLocalWorkSizeX );
                }
            }
            break;
        case 2:
            if( ( m_Config.NullLocalWorkSizeX != 0 ) &&
                ( m_Config.NullLocalWorkSizeY != 0 ) )
            {
                if( ( global_work_size[0] % m_Config.NullLocalWorkSizeX == 0 ) &&
                    ( global_work_size[1] % m_Config.NullLocalWorkSizeY == 0 ) )
                {
                    local_work_size = &m_Config.NullLocalWorkSizeX;
                }
                else
                {
                    std::lock_guard<std::mutex> lock(m_Mutex);
                    logf( "Couldn't override NULL local work size: < %zu x %zu > %% < %zu x %zu > != 0!\n",
                        global_work_size[0],
                        global_work_size[1],
                        m_Config.NullLocalWorkSizeX,
                        m_Config.NullLocalWorkSizeY );
                }
            }
            break;
        case 3:
            if( ( m_Config.NullLocalWorkSizeX != 0 ) &&
                ( m_Config.NullLocalWorkSizeY != 0 ) &&
                ( m_Config.NullLocalWorkSizeZ != 0 ) )
            {
                if( ( global_work_size[0] % m_Config.NullLocalWorkSizeX == 0 ) &&
                    ( global_work_size[1] % m_Config.NullLocalWorkSizeY == 0 ) &&
                    ( global_work_size[2] % m_Config.NullLocalWorkSizeZ == 0 ) )
                {
                    local_work_size = &m_Config.NullLocalWorkSizeX;
                }
                else
                {
                    std::lock_guard<std::mutex> lock(m_Mutex);
                    logf( "Couldn't override NULL local work size: < %zu x %zu x %zu > %% < %zu x %zu x %zu > != 0!\n",
                        global_work_size[0],
                        global_work_size[1],
                        global_work_size[2],
                        m_Config.NullLocalWorkSizeX,
                        m_Config.NullLocalWorkSizeY,
                        m_Config.NullLocalWorkSizeZ );
                }
            }
            break;
        default:
            // Nothing.
            break;
        }
    }
}